

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O0

bool __thiscall OpenMD::SimInfo::addMolecule(SimInfo *this,Molecule *mol)

{
  bool bVar1;
  size_t sVar2;
  Molecule *in_RSI;
  pair<int,_OpenMD::Molecule_*> *in_RDI;
  MoleculeIterator i;
  Molecule *in_stack_00000358;
  SimInfo *in_stack_00000360;
  map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  *in_stack_ffffffffffffff88;
  Molecule **__y;
  Molecule **__x;
  map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
  *in_stack_ffffffffffffffa0;
  _Self local_38;
  int local_2c;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_20;
  Molecule *local_18;
  
  local_18 = in_RSI;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_20);
  __x = &in_RDI[10].second;
  local_2c = Molecule::getGlobalIndex(local_18);
  local_28 = (_Base_ptr)
             std::
             map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
             ::find(in_stack_ffffffffffffff88,(key_type *)0x144e1f);
  local_20._M_node = local_28;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<int,_OpenMD::Molecule_*,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::operator==(&local_20,&local_38);
  if (bVar1) {
    __y = &in_RDI[10].second;
    Molecule::getGlobalIndex(local_18);
    std::make_pair<int,OpenMD::Molecule*&>((int *)__x,__y);
    std::
    map<int,OpenMD::Molecule*,std::less<int>,std::allocator<std::pair<int_const,OpenMD::Molecule*>>>
    ::insert<std::pair<int,OpenMD::Molecule*>>(in_stack_ffffffffffffffa0,in_RDI);
    sVar2 = Molecule::getNAtoms((Molecule *)0x144eb2);
    *(int *)&in_RDI[2].second = *(int *)&in_RDI[2].second + (int)sVar2;
    sVar2 = Molecule::getNBonds((Molecule *)0x144ece);
    *(int *)((long)&in_RDI[2].second + 4) = *(int *)((long)&in_RDI[2].second + 4) + (int)sVar2;
    sVar2 = Molecule::getNBends((Molecule *)0x144eea);
    in_RDI[3].first = in_RDI[3].first + (int)sVar2;
    sVar2 = Molecule::getNTorsions((Molecule *)0x144f06);
    *(int *)&in_RDI[3].field_0x4 = *(int *)&in_RDI[3].field_0x4 + (int)sVar2;
    sVar2 = Molecule::getNInversions((Molecule *)0x144f22);
    *(int *)&in_RDI[3].second = *(int *)&in_RDI[3].second + (int)sVar2;
    sVar2 = Molecule::getNRigidBodies((Molecule *)0x144f3e);
    *(int *)((long)&in_RDI[3].second + 4) = *(int *)((long)&in_RDI[3].second + 4) + (int)sVar2;
    sVar2 = Molecule::getNIntegrableObjects((Molecule *)0x144f5a);
    in_RDI[4].first = in_RDI[4].first + (int)sVar2;
    sVar2 = Molecule::getNCutoffGroups((Molecule *)0x144f76);
    *(int *)&in_RDI[4].field_0x4 = *(int *)&in_RDI[4].field_0x4 + (int)sVar2;
    sVar2 = Molecule::getNConstraintPairs((Molecule *)0x144f92);
    *(int *)&in_RDI[4].second = *(int *)&in_RDI[4].second + (int)sVar2;
    addInteractionPairs(in_stack_00000360,in_stack_00000358);
  }
  return bVar1;
}

Assistant:

bool SimInfo::addMolecule(Molecule* mol) {
    MoleculeIterator i;

    i = molecules_.find(mol->getGlobalIndex());
    if (i == molecules_.end()) {
      molecules_.insert(make_pair(mol->getGlobalIndex(), mol));

      nAtoms_ += mol->getNAtoms();
      nBonds_ += mol->getNBonds();
      nBends_ += mol->getNBends();
      nTorsions_ += mol->getNTorsions();
      nInversions_ += mol->getNInversions();
      nRigidBodies_ += mol->getNRigidBodies();
      nIntegrableObjects_ += mol->getNIntegrableObjects();
      nCutoffGroups_ += mol->getNCutoffGroups();
      nConstraints_ += mol->getNConstraintPairs();

      addInteractionPairs(mol);

      return true;
    } else {
      return false;
    }
  }